

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
          (ShaderImageLoadStoreBase *this,GLuint program,string *name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *name_index_map,GLint size,GLenum type)

{
  GLenum GVar1;
  bool bVar2;
  GLenum GVar3;
  pointer ppVar4;
  undefined8 uVar5;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  uint local_74;
  uint local_70;
  GLenum type_gl;
  GLint size_gl;
  GLsizei length_gl;
  GLchar name_gl [32];
  _Self local_40;
  const_iterator iter;
  GLenum type_local;
  GLint size_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *name_index_map_local;
  string *name_local;
  GLuint program_local;
  ShaderImageLoadStoreBase *this_local;
  
  iter._M_node._0_4_ = type;
  iter._M_node._4_4_ = size;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(name_index_map,name);
  name_gl._24_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(name_index_map);
  bVar2 = std::operator!=(&local_40,(_Self *)(name_gl + 0x18));
  if (!bVar2) {
    __assert_fail("iter != name_index_map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x27a,
                  "bool gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::CheckUniform(GLuint, const std::string &, const std::map<std::string, GLuint> &, GLint, GLenum)"
                 );
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
           ::operator->(&local_40);
  glu::CallLogWrapper::glGetActiveUniform
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,ppVar4->second,
             0x20,(GLsizei *)&type_gl,(GLint *)&local_70,&local_74,(GLchar *)&size_gl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,(char *)&size_gl,&local_99)
  ;
  bVar2 = std::operator!=(&local_98,name);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  GVar1 = type_gl;
  if (bVar2) {
    uVar5 = std::__cxx11::string::c_str();
    anon_unknown_0::Output("Uniform name is %s should be %s.\n",&size_gl,uVar5);
    this_local._7_1_ = false;
  }
  else {
    GVar3 = std::__cxx11::string::length();
    if (GVar1 == GVar3) {
      if (local_70 == iter._M_node._4_4_) {
        if (local_74 == (GLenum)iter._M_node) {
          this_local._7_1_ = true;
        }
        else {
          anon_unknown_0::Output
                    ("Uniform type is %d should be %d (%s).\n",(ulong)local_74,
                     (ulong)(GLenum)iter._M_node,&size_gl);
          this_local._7_1_ = false;
        }
      }
      else {
        anon_unknown_0::Output
                  ("Uniform size is %d should be %d (%s).\n",(ulong)local_70,
                   (ulong)iter._M_node._4_4_,&size_gl);
        this_local._7_1_ = false;
      }
    }
    else {
      uVar5 = std::__cxx11::string::length();
      anon_unknown_0::Output
                ("Uniform length is %d should be %d (%s).\n",(ulong)type_gl,uVar5,&size_gl);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CheckUniform(GLuint program, const std::string& name, const std::map<std::string, GLuint>& name_index_map,
					  GLint size, GLenum type)
	{
		std::map<std::string, GLuint>::const_iterator iter = name_index_map.find(name);
		assert(iter != name_index_map.end());

		GLchar  name_gl[32];
		GLsizei length_gl;
		GLint   size_gl;
		GLenum  type_gl;

		glGetActiveUniform(program, iter->second, sizeof(name_gl), &length_gl, &size_gl, &type_gl, name_gl);

		if (std::string(name_gl) != name)
		{
			Output("Uniform name is %s should be %s.\n", name_gl, name.c_str());
			return false;
		}
		if (length_gl != static_cast<GLsizei>(name.length()))
		{
			Output("Uniform length is %d should be %d (%s).\n", length_gl, name.length(), name_gl);
			return false;
		}
		if (size_gl != size)
		{
			Output("Uniform size is %d should be %d (%s).\n", size_gl, size, name_gl);
			return false;
		}
		if (type_gl != type)
		{
			Output("Uniform type is %d should be %d (%s).\n", type_gl, type, name_gl);
			return false;
		}

		return true;
	}